

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall ot::commissioner::Interpreter::Value::Value(Value *this,Error *aError)

{
  Error::Error(&this->mError,aError);
  (this->mData)._M_dataplus._M_p = (pointer)&(this->mData).field_2;
  (this->mData)._M_string_length = 0;
  (this->mData).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Interpreter::Value::Value(Error aError)
    : mError(aError)
{
}